

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::coreQuery_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view queryStr,bool force_ordering)

{
  data *this_00;
  value_t vVar1;
  ushort index;
  pointer ppVar2;
  pointer pcVar3;
  pointer pcVar4;
  json_value jVar5;
  string_view request;
  undefined8 uVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  string *val;
  const_iterator cVar11;
  FedInfo **ppFVar12;
  string *psVar13;
  reference pvVar14;
  long *plVar15;
  long lVar16;
  pointer ptVar17;
  uint uVar18;
  pointer ppVar19;
  FedInfo **ppFVar20;
  char *pcVar21;
  code *pcVar22;
  FedInfo **ppFVar23;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar24;
  uint uVar25;
  int *__s1;
  JsonMapBuilder *this_01;
  FedInfo *pFVar26;
  size_type __rlen;
  helics *phVar27;
  undefined8 uVar28;
  size_type __rlen_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_00;
  string_view request_00;
  string_view fmt;
  format_args args;
  json tagBlock_1;
  json base;
  string interfaceQueryResult;
  string res;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffe68;
  _Any_data local_188;
  undefined1 local_178 [16];
  data local_168;
  string local_158;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  Time local_128;
  json_value jStack_120;
  Time local_110;
  data local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  _Alloc_hider local_c8;
  key_type local_c0;
  key_type local_a0;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  data local_50;
  data local_40;
  
  plVar15 = (long *)queryStr._M_str;
  phVar27 = (helics *)queryStr._M_len;
  local_138._M_len = (size_t)phVar27;
  local_138._M_str = (char *)plVar15;
  quickCoreQueries_abi_cxx11_(&local_e8,this,queryStr);
  if (local_e8._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e8._M_string_length;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    goto LAB_002a64dd;
  }
  if (phVar27 == (helics *)0x4) {
    if ((int)*plVar15 == 0x73676174) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_158,(initializer_list_t)ZEXT816(0),false,object);
      ppVar19 = (this->tags).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->tags).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 != ppVar2) {
        do {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_f8,&ppVar19->second);
          pcVar4 = (ppVar19->first)._M_dataplus._M_p;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar4,pcVar4 + (ppVar19->first)._M_string_length);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_158,&local_a0);
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_f8._M_local_buf[0];
          jVar5 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = (json_value)local_f8._8_8_;
          local_f8._M_local_buf[0] = vVar1;
          local_f8._8_8_ = jVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_f8);
          ppVar19 = ppVar19 + 1;
        } while (ppVar19 != ppVar2);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_158,true);
LAB_002a6873:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_158);
      goto LAB_002a64dd;
    }
  }
  else if ((phVar27 == (helics *)0x9) && ((char)plVar15[1] == 's' && *plVar15 == 0x6574617265646566)
          ) {
    local_110.internalTimeCode = (baseType)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_110.internalTimeCode;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    if ((this->loopFederates).dataStorage.csize == 0) {
      uVar10 = (this->loopFederates).dataStorage.bsize;
      ppFVar12 = (this->loopFederates).dataStorage.dataptr;
      if ((long)(int)uVar10 == 0x20) {
        lVar16 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
        if (ppFVar12 == (FedInfo **)0x0) {
          ppFVar20 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar20 = ppFVar12 + lVar16 + 1;
        }
        pFVar26 = *ppFVar20;
        uVar10 = 0;
        uVar18 = 0x20;
      }
      else {
        lVar16 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
        ppFVar20 = ppFVar12 + lVar16;
        pFVar26 = *ppFVar20 + (int)uVar10;
        uVar18 = uVar10;
      }
    }
    else {
      ppFVar12 = (this->loopFederates).dataStorage.dataptr;
      pFVar26 = *ppFVar12;
      lVar16 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      uVar10 = 0;
      ppFVar20 = ppFVar12;
      uVar18 = (this->loopFederates).dataStorage.bsize;
    }
    if (ppFVar12 == (FedInfo **)0x0) {
      ppFVar23 = (FedInfo **)
                 &gmlc::containers::
                  StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                  emptyValue;
    }
    else {
      ppFVar23 = ppFVar12 + lVar16 + 1;
    }
    ppFVar12 = ppFVar12 + lVar16;
    if (uVar18 == 0x20) {
      ppFVar12 = ppFVar23;
    }
    uVar25 = 0;
    if (uVar18 != 0x20) {
      uVar25 = uVar18;
    }
    if ((uVar10 != uVar25) || (ppFVar20 != ppFVar12)) {
      this_00 = (data *)(local_178 + 0x10);
      local_c8._M_p = (pointer)ppFVar12;
      do {
        pcVar3 = (pFVar26->fed->name)._M_dataplus._M_p;
        local_188._M_unused._M_object = local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar3,pcVar3 + (pFVar26->fed->name)._M_string_length);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump((string_t *)&local_158,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this_00,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(this_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_158._M_dataplus._M_p,local_158._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)local_178) {
          operator_delete(local_188._M_unused._M_object,(ulong)(local_178._0_8_ + 1));
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,',');
        if ((int)uVar10 < 0x1f) {
          pFVar26 = pFVar26 + 1;
          uVar10 = uVar10 + 1;
        }
        else {
          ppFVar20 = ppFVar20 + (ulong)(uVar10 - 0x1f >> 5) + 1;
          uVar10 = uVar10 + 1 & 0x1f;
          pFVar26 = (FedInfo *)((long)&(*ppFVar20)->fed + (ulong)(uVar10 << 4));
        }
      } while ((uVar10 != uVar25) || (ppFVar20 != (FedInfo **)local_c8._M_p));
      if (1 < __return_storage_ptr__->_M_string_length) {
        (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] =
             ']';
        goto LAB_002a64dd;
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
    goto LAB_002a64dd;
  }
  iVar9 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_138,0,4,"tag/")
  ;
  if (iVar9 == 0) {
    ppVar19 = (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar19 != ppVar2) {
      __s1 = (int *)((long)local_138._M_str + 4);
      phVar27 = (helics *)(local_138._M_len - 4);
      val_00 = &ppVar19->second;
      do {
        if ((phVar27 == (helics *)val_00[-1]._M_string_length) &&
           ((phVar27 == (helics *)0x0 ||
            (iVar9 = bcmp(__s1,val_00[-1]._M_dataplus._M_p,(size_t)phVar27), iVar9 == 0)))) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_158,val_00);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)__return_storage_ptr__,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_158,-1,' ',true,hex);
          goto LAB_002a6873;
        }
        ppVar19 = (pointer)(val_00 + 1);
        val_00 = val_00 + 2;
      } while (ppVar19 != ppVar2);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
    goto LAB_002a64dd;
  }
  aVar24.values_ = (value<fmt::v11::context> *)&local_188;
  local_188._8_8_ = (CommonCore *)0x0;
  local_178._8_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2895:22)>
       ::_M_invoke;
  local_178._0_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2895:22)>
       ::_M_manager;
  request_00._M_str = (char *)&this->loopHandles;
  request_00._M_len = (size_t)local_138._M_str;
  local_188._M_unused._M_object = this;
  generateInterfaceQueryResults
            (&local_158,(helics *)local_138._M_len,request_00,(HandleManager *)0x8831d580,
             (GlobalFederateId)aVar24._0_4_,in_stack_fffffffffffffe68);
  if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
    (*(code *)local_178._0_8_)(&local_188,&local_188,3);
  }
  pcVar21 = local_138._M_str;
  sVar7 = local_138._M_len;
  if (local_158._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_158._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_158._M_string_length;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    goto LAB_002a681d;
  }
  switch(local_138._M_len) {
  case 4:
    iVar9 = bcmp(local_138._M_str,"logs",local_138._M_len);
    if (iVar9 != 0) goto switchD_002a6689_caseD_5;
    local_168.m_type = 0;
    local_168.m_value.object = (object_t *)0x0;
    local_178._0_8_ = (_func_int **)0x0;
    local_178._8_8_ = (_func_int **)0x0;
    local_188._M_unused._M_object = (CommonCore *)0x0;
    local_188._8_8_ = (CommonCore *)0x0;
    loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                      (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                       *)&local_188);
    if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
      (*(code *)local_178._0_8_)(&local_188,&local_188,3);
    }
    bufferToJson(&((this->super_BrokerBase).mLogManager.
                   super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  mLogBuffer,(json *)(local_178 + 0x10));
    fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
    goto LAB_002a7455;
  default:
    goto switchD_002a6689_caseD_5;
  case 6:
    iVar9 = bcmp(local_138._M_str,"isinit",local_138._M_len);
    if (iVar9 != 0) goto switchD_002a6689_caseD_5;
    bVar8 = allInitReady(this);
    pcVar21 = "false";
    if (bVar8) {
      pcVar21 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar21,pcVar21 + ((ulong)bVar8 ^ 5));
    break;
  case 7:
    iVar9 = bcmp(local_138._M_str,"address",local_138._M_len);
    if (iVar9 == 0) {
      psVar13 = getAddress_abi_cxx11_(this);
      generateJsonQuotedString(__return_storage_ptr__,psVar13);
    }
    else {
      if (*(int *)((long)pcVar21 + 3) != 0x7265746e || *(int *)pcVar21 != 0x6e756f63)
      goto switchD_002a6689_caseD_5;
      iVar9 = generateMapObjectCounter(this);
      local_188._0_4_ = iVar9;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2;
      args.field_1.values_ = aVar24.values_;
      args.desc_ = (unsigned_long_long)&local_188;
      ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x3d965e,fmt,args);
    }
    break;
  case 9:
    if (*(char *)((long)local_138._M_str + 8) != 'n' ||
        *(long *)local_138._M_str != 0x6f73646e65706564) goto switchD_002a6689_caseD_5;
    BaseTimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &local_188,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CommonCore::coreQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)const::__6>
              (__return_storage_ptr__,&local_188);
LAB_002a727e:
    if ((CommonCore *)local_188._M_unused._0_8_ == (CommonCore *)0x0) break;
    pcVar22 = (code *)(local_178._0_8_ - local_188._0_8_);
    goto LAB_002a7294;
  case 10:
    iVar9 = bcmp(local_138._M_str,"dependents",local_138._M_len);
    if (iVar9 == 0) {
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_188,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CommonCore::coreQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)const::__7>
                (__return_storage_ptr__,&local_188);
      goto LAB_002a727e;
    }
    iVar9 = bcmp(pcVar21,"interfaces",sVar7);
    if (iVar9 == 0) {
      local_168.m_type = 0;
      local_168.m_value.object = (object_t *)0x0;
      local_188._8_8_ = (CommonCore *)0x0;
      local_178._8_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2977:33)>
           ::_M_invoke;
      local_178._0_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2977:33)>
           ::_M_manager;
      local_188._M_unused._M_object = this;
      loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)&local_188);
      if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
        (*(code *)local_178._0_8_)(&local_188,&local_188,3);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
      goto LAB_002a7455;
    }
    goto switchD_002a6689_caseD_5;
  case 0xb:
    iVar9 = bcmp(local_138._M_str,"version_all",local_138._M_len);
    if (iVar9 == 0) {
      local_168.m_type = 0;
      local_168.m_value.object = (object_t *)0x0;
      local_188._M_unused._M_object = (CommonCore *)0x0;
      local_188._8_8_ = (CommonCore *)0x0;
      local_178._8_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2962:33)>
           ::_M_invoke;
      local_178._0_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2962:33)>
           ::_M_manager;
      loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)&local_188);
      if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
        (*(code *)local_178._0_8_)(&local_188,&local_188,3);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_char_*const_&,_const_char_*,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,&versionString);
      pvVar14 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)(local_178 + 0x10),"version");
      vVar1 = (pvVar14->m_data).m_type;
      (pvVar14->m_data).m_type = local_40.m_type;
      jVar5 = (pvVar14->m_data).m_value;
      (pvVar14->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
      goto LAB_002a7455;
    }
    goto switchD_002a6689_caseD_5;
  case 0xc:
    iVar9 = bcmp(local_138._M_str,"current_time",local_138._M_len);
    if (iVar9 != 0) goto switchD_002a6689_caseD_5;
    if ((this->super_BrokerBase).hasTimeDependency == false) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{}","");
    }
    else {
      (*((this->super_BrokerBase).timeCoord._M_t.
         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
         ._M_t.
         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
        _vptr_BaseTimeCoordinator[0xb])(__return_storage_ptr__);
    }
    break;
  case 0xd:
    iVar9 = bcmp(local_138._M_str,"current_state",local_138._M_len);
    if (iVar9 == 0) {
      local_168.m_type = 0;
      local_168.m_value.object = (object_t *)0x0;
      local_188._M_unused._M_object = (CommonCore *)0x0;
      local_188._8_8_ = (CommonCore *)0x0;
      local_178._8_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2968:33)>
           ::_M_invoke;
      local_178._0_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2968:33)>
           ::_M_manager;
      loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)&local_188);
      if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
        (*(code *)local_178._0_8_)(&local_188,&local_188,3);
      }
      val = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,val);
      pvVar14 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)(local_178 + 0x10),"state");
      vVar1 = (pvVar14->m_data).m_type;
      (pvVar14->m_data).m_type = local_50.m_type;
      jVar5 = (pvVar14->m_data).m_value;
      (pvVar14->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
      goto LAB_002a7455;
    }
switchD_002a6689_caseD_5:
    cVar11 = std::
             _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                     *)mapIndex,(key_type *)&local_138);
    pcVar21 = local_138._M_str;
    sVar7 = local_138._M_len;
    if (cVar11._M_node == (_Base_ptr)(mapIndex + 8)) {
      if ((helics *)local_138._M_len == (helics *)0xc) {
        if (*(int *)((long)local_138._M_str + 8) == 0x73656963 &&
            *(long *)local_138._M_str == 0x6e65646e65706564) {
          local_168.m_type = 0;
          local_168.m_value.object = (object_t *)0x0;
          local_178._0_8_ = (_func_int **)0x0;
          local_178._8_8_ = (_func_int **)0x0;
          local_188._M_unused._M_object = (CommonCore *)0x0;
          local_188._8_8_ = (CommonCore *)0x0;
          loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                             *)&local_188);
          if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
            (*(code *)local_178._0_8_)(&local_188,&local_188,3);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)local_60,(initializer_list_t)ZEXT816(0),false,array);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)(local_178 + 0x10),"dependents");
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_60[0];
          jVar5 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = (json_value)local_60._8_8_;
          local_60[0] = vVar1;
          local_60._8_8_ = jVar5;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_60);
          BaseTimeCoordinator::getDependents
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_188,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          uVar6 = local_188._8_8_;
          if (local_188._M_unused._M_object != (void *)local_188._8_8_) {
            uVar28 = local_188._M_unused._0_8_;
            do {
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)(local_178 + 0x10),"dependents");
              local_128.internalTimeCode = 0;
              jStack_120.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_128,
                         (long)*(int *)&(((CommonCore *)uVar28)->super_Core)._vptr_Core);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar14,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&local_128);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_128);
              uVar28 = (long)&(((CommonCore *)uVar28)->super_Core)._vptr_Core + 4;
            } while (uVar28 != uVar6);
          }
          if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)0x0) {
            operator_delete(local_188._M_unused._M_object,local_178._0_8_ - local_188._0_8_);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)(local_80 + 0x10),(initializer_list_t)ZEXT816(0),false,array);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)(local_178 + 0x10),"dependencies");
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_80[0x10];
          jVar5 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = (json_value)local_80._24_8_;
          local_80[0x10] = vVar1;
          local_80._24_8_ = jVar5;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)(local_80 + 0x10));
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_188,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          uVar6 = local_188._8_8_;
          if (local_188._M_unused._M_object != (void *)local_188._8_8_) {
            uVar28 = local_188._M_unused._0_8_;
            do {
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)(local_178 + 0x10),"dependencies");
              local_128.internalTimeCode = 0;
              jStack_120.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_128,
                         (long)*(int *)&(((CommonCore *)uVar28)->super_Core)._vptr_Core);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar14,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&local_128);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_128);
              uVar28 = (long)&(((CommonCore *)uVar28)->super_Core)._vptr_Core + 4;
            } while (uVar28 != uVar6);
          }
          if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)0x0) {
            operator_delete(local_188._M_unused._M_object,local_178._0_8_ - local_188._0_8_);
          }
          fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
        }
        else {
          if (*(int *)((long)local_138._M_str + 8) != 0x70616d5f ||
              *(long *)local_138._M_str != 0x6574617265646566) goto LAB_002a6d76;
          local_168.m_type = 0;
          local_168.m_value.object = (object_t *)0x0;
          local_188._M_unused._M_object = (CommonCore *)0x0;
          local_188._8_8_ = (CommonCore *)0x0;
          local_178._8_8_ =
               std::
               _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3024:33)>
               ::_M_invoke;
          local_178._0_8_ =
               std::
               _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3024:33)>
               ::_M_manager;
          loadBasicJsonInfo(this,(json *)(local_178 + 0x10),
                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                             *)&local_188);
          if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
            (*(code *)local_178._0_8_)(&local_188,&local_188,3);
          }
          if ((this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_188,(initializer_list_t)ZEXT816(0),false,object);
            ppVar19 = (this->tags).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar2 = (this->tags).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar19 != ppVar2) {
              do {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_108,&ppVar19->second);
                pcVar4 = (ppVar19->first)._M_dataplus._M_p;
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c0,pcVar4,pcVar4 + (ppVar19->first)._M_string_length);
                pvVar14 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&local_188,&local_c0);
                vVar1 = (pvVar14->m_data).m_type;
                (pvVar14->m_data).m_type = local_108.m_type;
                jVar5 = (pvVar14->m_data).m_value;
                (pvVar14->m_data).m_value = local_108.m_value;
                local_108.m_type = vVar1;
                local_108.m_value = jVar5;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_108);
                ppVar19 = ppVar19 + 1;
              } while (ppVar19 != ppVar2);
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)local_80,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_188);
            pvVar14 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)(local_178 + 0x10),"tags");
            vVar1 = (pvVar14->m_data).m_type;
            (pvVar14->m_data).m_type = local_80[0];
            jVar5 = (pvVar14->m_data).m_value;
            (pvVar14->m_data).m_value = (json_value)local_80._8_8_;
            local_80[0] = vVar1;
            local_80._8_8_ = jVar5;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)local_80);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_188);
          }
          fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x10),true);
        }
LAB_002a7455:
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)(local_178 + 0x10));
      }
      else {
LAB_002a6d76:
        ppVar19 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar19 != ppVar2) {
          psVar13 = (string *)&ppVar19->second;
          do {
            if (((helics *)sVar7 == (helics *)psVar13[-1]._M_string_length) &&
               (((helics *)sVar7 == (helics *)0x0 ||
                (iVar9 = bcmp(pcVar21,psVar13[-1]._M_dataplus._M_p,sVar7), iVar9 == 0)))) {
              generateJsonQuotedString(__return_storage_ptr__,psVar13);
              goto LAB_002a681d;
            }
            ppVar19 = (pointer)(psVar13 + 1);
            psVar13 = psVar13 + 2;
          } while (ppVar19 != ppVar2);
        }
        local_188._M_unused._M_object = (CommonCore *)local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"unrecognized core query","");
        generateJsonErrorResponse(__return_storage_ptr__,BAD_REQUEST,(string *)&local_188);
        if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)local_178) {
          pcVar22 = (code *)(local_178._0_8_ + 1);
LAB_002a7294:
          operator_delete(local_188._M_unused._M_object,(ulong)pcVar22);
        }
      }
    }
    else {
      index = *(ushort *)&cVar11._M_node[1]._M_left;
      uVar10 = (uint)index;
      ptVar17 = (this->mapBuilders).
                super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((uint)index <
           (((uint)(*(int *)&(this->mapBuilders).
                             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar17) >> 5) *
            -0x55555555 & 0xffff)) && (*(char *)((long)&cVar11._M_node[1]._M_left + 2) == '\0')) {
        this_01 = (JsonMapBuilder *)
                  ((long)&(ptVar17->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                          _M_head_impl.jMap._M_t.
                          super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          .
                          super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                          ._M_head_impl + (ulong)(uVar10 * 0x60));
        bVar8 = fileops::JsonMapBuilder::isCompleted(this_01);
        if (bVar8) {
          iVar9 = generateMapObjectCounter(this);
          if (iVar9 == *(int *)((long)&(ptVar17->
                                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                       ).
                                       super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                                       ._M_head_impl.counterCode + (ulong)(uVar10 * 0x60))) {
            fileops::JsonMapBuilder::generate_abi_cxx11_(__return_storage_ptr__,this_01);
            break;
          }
          fileops::JsonMapBuilder::reset(this_01);
        }
        if ((this_01->jMap)._M_t.
            super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            .
            super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
            ._M_head_impl !=
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)0x0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"#wait","");
          break;
        }
      }
      request._M_str = local_138._M_str;
      request._M_len = local_138._M_len;
      initializeMapBuilder
                (this,request,index,*(QueryReuse *)((long)&cVar11._M_node[1]._M_left + 2),
                 force_ordering);
      bVar8 = fileops::JsonMapBuilder::isCompleted
                        ((JsonMapBuilder *)
                         ((long)&(((this->mapBuilders).
                                   super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                 _M_head_impl.jMap._M_t.
                                 super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                 .
                                 super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                                 ._M_head_impl + (ulong)(uVar10 * 0x60)));
      if (bVar8) {
        if (*(char *)((long)&cVar11._M_node[1]._M_left + 2) == '\0') {
          iVar9 = generateMapObjectCounter(this);
          ptVar17 = (this->mapBuilders).
                    super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)&(ptVar17->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                          _M_head_impl.counterCode + (ulong)(uVar10 * 0x60)) = iVar9;
        }
        else {
          ptVar17 = (this->mapBuilders).
                    super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        fileops::JsonMapBuilder::generate_abi_cxx11_
                  (__return_storage_ptr__,
                   (JsonMapBuilder *)
                   ((long)&(ptVar17->
                           super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                           ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                           _M_head_impl.jMap._M_t.
                           super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           .
                           super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                           ._M_head_impl + (ulong)(uVar10 * 0x60)));
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#wait","")
        ;
      }
    }
    break;
  case 0x12:
    iVar9 = bcmp(local_138._M_str,"filtered_endpoints",local_138._M_len);
    if (iVar9 != 0) goto switchD_002a6689_caseD_5;
    filteredEndpointQuery_abi_cxx11_(__return_storage_ptr__,this,(FederateState *)0x0);
  }
LAB_002a681d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
LAB_002a64dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::coreQuery(std::string_view queryStr, bool force_ordering) const
{
    auto addHeader = [this](nlohmann::json& base) { loadBasicJsonInfo(base, nullptr); };

    auto res = quickCoreQueries(queryStr);
    if (!res.empty()) {
        return res;
    }
    if (queryStr == "federates") {
        return generateStringVector(loopFederates,
                                    [](const auto& fed) { return fed->getIdentifier(); });
    }
    if (queryStr == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (queryStr.compare(0, 4, "tag/") == 0) {
        std::string_view queriedTag = queryStr;
        queriedTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (queriedTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(queryStr, loopHandles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (queryStr == "dependson") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }

    if (queryStr == "isinit") {
        return (allInitReady()) ? "true" : "false";
    }
    if (queryStr == "logs") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "address") {
        return generateJsonQuotedString(getAddress());
    }
    if (queryStr == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (queryStr == "filtered_endpoints") {
        return filteredEndpointQuery(nullptr);
    }
    if (queryStr == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (queryStr == "version_all") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& /*val*/, const FedInfo& /*fed*/) {});
        base["version"] = versionString;
        return fileops::generateJsonString(base);
    }
    if (queryStr == "current_state") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            val["state"] = stateString(fed.state);
        });
        base["state"] = brokerStateName(getBrokerState());

        return fileops::generateJsonString(base);
    }
    if (queryStr == "interfaces") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [this](nlohmann::json& val, const FedInfo& fed) {
            generateInterfaceConfig(val, loopHandles, fed->global_id);
        });
        return fileops::generateJsonString(base);
    }
    auto maploc = mapIndex.find(queryStr);
    if (maploc != mapIndex.end()) {
        auto index = maploc->second.first;
        if (isValidIndex(index, mapBuilders) && maploc->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(queryStr, index, maploc->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (maploc->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    if (queryStr == "dependencies") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "federate_map") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            if (fed.fed->try_lock()) {
                addFederateTags(val, fed.fed);
                fed.fed->unlock();
            } else {
                addFederateTags(val, fed.fed);
            }
        });
        // add core tags if needed
        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        return fileops::generateJsonString(base);
    }
    // check tag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == queryStr) {
            return generateJsonQuotedString(tag.second);
        }
    }
    // if nothing found generate an error response
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized core query");
}